

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

char * getSelectionString(Atom selection)

{
  Atom AVar1;
  int iVar2;
  Window WVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __size;
  long lVar7;
  bool bVar8;
  char *data;
  unsigned_long itemCount;
  long local_1f8;
  int actualFormat;
  long local_1e8;
  Atom actualType;
  Atom targets [2];
  unsigned_long bytesAfter;
  XEvent notification;
  XEvent dummy;
  
  targets[0] = _glfw.x11.UTF8_STRING;
  targets[1] = 0x1f;
  lVar4 = (ulong)(_glfw.x11.PRIMARY != selection) * 8;
  lVar7 = lVar4 + 0x206a0;
  WVar3 = (*_glfw.x11.xlib.GetSelectionOwner)(_glfw.x11.display,selection);
  if (WVar3 != _glfw.x11.helperWindowHandle) {
    free(*(void **)((long)_glfw.x11.keynames + lVar4 + -0x10));
    *(undefined8 *)((long)_glfw.x11.keynames + lVar4 + -0x10) = 0;
    lVar4 = 0;
    local_1e8 = lVar7;
    do {
      AVar1 = targets[lVar4];
      local_1f8 = lVar4;
      (*_glfw.x11.xlib.ConvertSelection)
                (_glfw.x11.display,selection,AVar1,_glfw.x11.GLFW_SELECTION,
                 _glfw.x11.helperWindowHandle,0);
      while( true ) {
        iVar2 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                          (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,&notification);
        if (iVar2 != 0) break;
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.time == 0) {
        bVar8 = false;
      }
      else {
        (*_glfw.x11.xlib.CheckIfEvent)
                  (_glfw.x11.display,&dummy,isSelPropNewValueNotify,(XPointer)&notification.type);
        (*_glfw.x11.xlib.GetWindowProperty)
                  (_glfw.x11.display,notification.xany.window,notification.xselectionrequest.target,
                   0,0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                   (uchar **)&data);
        if (actualType == _glfw.x11.INCR) {
          __size = 1;
          pcVar5 = (char *)0x0;
          do {
            while( true ) {
              iVar2 = (*_glfw.x11.xlib.CheckIfEvent)
                                (_glfw.x11.display,&dummy,isSelPropNewValueNotify,
                                 (XPointer)&notification.type);
              if (iVar2 != 0) break;
              waitForEvent((double *)0x0);
            }
            (*_glfw.x11.xlib.Free)(data);
            (*_glfw.x11.xlib.GetWindowProperty)
                      (_glfw.x11.display,notification.xany.window,
                       notification.xselectionrequest.target,0,0x7fffffffffffffff,1,0,&actualType,
                       &actualFormat,&itemCount,&bytesAfter,(uchar **)&data);
            if (itemCount != 0) {
              __size = __size + itemCount;
              pcVar5 = (char *)realloc(pcVar5,__size);
              pcVar5[~itemCount + __size] = '\0';
              strcat(pcVar5,data);
            }
          } while (itemCount != 0);
          if (targets[local_1f8] == 0x1f) {
            pcVar6 = convertLatin1toUTF8(pcVar5);
            lVar7 = local_1e8;
            *(char **)((long)&_glfw.initialized + local_1e8) = pcVar6;
            free(pcVar5);
          }
          else {
            *(char **)((long)&_glfw.initialized + local_1e8) = pcVar5;
            lVar7 = local_1e8;
          }
        }
        else if (actualType == AVar1) {
          if (AVar1 == 0x1f) {
            pcVar5 = convertLatin1toUTF8(data);
          }
          else {
            pcVar5 = _glfw_strdup(data);
          }
          *(char **)((long)&_glfw.initialized + lVar7) = pcVar5;
        }
        (*_glfw.x11.xlib.Free)(data);
        bVar8 = *(long *)((long)&_glfw.initialized + lVar7) != 0;
      }
    } while ((!bVar8) && (lVar4 = local_1f8 + 1, local_1f8 == 0));
    if (*(long *)((long)&_glfw.initialized + lVar7) == 0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
    }
  }
  return *(char **)((long)&_glfw.initialized + lVar7);
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}